

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::GetTargetDirectDepends
          (cmComputeTargetDepends *this,cmGeneratorTarget *t,cmTargetDependSet *deps)

{
  const_iterator this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  reference this_02;
  reference ppcVar4;
  pointer pcVar5;
  cmListFileBacktrace *bt;
  pair<std::_Rb_tree_const_iterator<cmTargetDepend>,_bool> pVar6;
  cmTargetDepend local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  _Rb_tree_const_iterator<cmTargetDepend> local_80;
  iterator di;
  cmGeneratorTarget *dep;
  cmGraphEdge *ni;
  const_iterator __end1;
  const_iterator __begin1;
  EdgeList *__range1;
  EdgeList *nl;
  iterator iStack_40;
  int i;
  _Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_> local_28;
  const_iterator tii;
  cmTargetDependSet *deps_local;
  cmGeneratorTarget *t_local;
  cmComputeTargetDepends *this_local;
  
  tii._M_node = (_Base_ptr)deps;
  deps_local = (cmTargetDependSet *)t;
  t_local = (cmGeneratorTarget *)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
       ::find(&this->TargetIndex,(key_type *)&deps_local);
  std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::
  _Rb_tree_const_iterator(&local_28,&local_30);
  iStack_40 = std::
              map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
              ::end(&this->TargetIndex);
  std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::
  _Rb_tree_const_iterator(&local_38,&stack0xffffffffffffffc0);
  bVar1 = std::operator!=(&local_28,&local_38);
  if (!bVar1) {
    __assert_fail("tii != this->TargetIndex.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmComputeTargetDepends.cxx"
                  ,0x91,
                  "void cmComputeTargetDepends::GetTargetDirectDepends(const cmGeneratorTarget *, cmTargetDependSet &)"
                 );
  }
  ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::operator->
                     (&local_28);
  this_01 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                       (&(this->FinalGraph).
                         super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                        (long)ppVar3->second)->
             super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  __end1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_01);
  ni = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                *)&ni);
    if (!bVar1) break;
    this_02 = __gnu_cxx::
              __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
              ::operator*(&__end1);
    iVar2 = cmGraphEdge::operator_cast_to_int(this_02);
    ppcVar4 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(long)iVar2);
    this_00 = tii;
    di._M_node = (_Base_ptr)*ppcVar4;
    cmTargetDepend::cmTargetDepend(&local_b0,(cmGeneratorTarget *)di._M_node);
    pVar6 = std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
            insert((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                    *)this_00._M_node,&local_b0);
    local_90 = (_Base_ptr)pVar6.first._M_node;
    local_88 = pVar6.second;
    local_80._M_node = local_90;
    cmTargetDepend::~cmTargetDepend(&local_b0);
    pcVar5 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator->(&local_80);
    bVar1 = cmGraphEdge::IsStrong(this_02);
    cmTargetDepend::SetType(pcVar5,bVar1);
    pcVar5 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator->(&local_80);
    bt = cmGraphEdge::GetBacktrace(this_02);
    cmTargetDepend::SetBacktrace(pcVar5,bt);
    __gnu_cxx::
    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::GetTargetDirectDepends(cmGeneratorTarget const* t,
                                                    cmTargetDependSet& deps)
{
  // Lookup the index for this target.  All targets should be known by
  // this point.
  std::map<cmGeneratorTarget const*, int>::const_iterator tii =
    this->TargetIndex.find(t);
  assert(tii != this->TargetIndex.end());
  int i = tii->second;

  // Get its final dependencies.
  EdgeList const& nl = this->FinalGraph[i];
  for (cmGraphEdge const& ni : nl) {
    cmGeneratorTarget const* dep = this->Targets[ni];
    cmTargetDependSet::iterator di = deps.insert(dep).first;
    di->SetType(ni.IsStrong());
    di->SetBacktrace(ni.GetBacktrace());
  }
}